

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.h
# Opt level: O0

void __thiscall iqnet::ssl::connection_close::~connection_close(connection_close *this)

{
  connection_close *this_local;
  
  ~connection_close(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

class LIBIQXMLRPC_API connection_close: public ssl::exception {
  bool clean;
public:
  connection_close( bool clean_ ):
    exception( "Connection has been closed." ),
    clean(clean_) {}

  bool is_clean() const { return clean; }
}